

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int grad_calc2(custom_function *funcpt,double *x,int N,double *dx,double eps3,double *f)

{
  double dVar1;
  ulong uVar2;
  char *__format;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar3 = x[uVar2];
      if (ABS(dVar3) < 1.0 / ABS(dx[uVar2])) {
        dVar3 = signx(dVar3);
        dVar3 = dVar3 / ABS(dx[uVar2]);
      }
      dVar1 = x[uVar2];
      dVar5 = dVar3 * eps3 + dVar1;
      x[uVar2] = dVar5;
      dVar3 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar3)) {
LAB_00141b34:
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00141b44:
        printf(__format);
        return 0xf;
      }
      if (NAN(dVar3)) {
LAB_00141b3d:
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00141b44;
      }
      dVar5 = dVar5 - dVar1;
      x[uVar2] = dVar1 - dVar5;
      dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar4)) goto LAB_00141b34;
      if (NAN(dVar4)) goto LAB_00141b3d;
      f[uVar2] = (dVar3 - dVar4) / (dVar5 + dVar5);
      x[uVar2] = dVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return 0;
}

Assistant:

int grad_calc2(custom_function *funcpt, double *x, int N, double *dx, double eps3, double *f) {
	int j,retval;
	double stepsize,stepmax,temp;
	double fp,fm;

	retval = 0;

	for (j = 0; j < N;++j) {
		if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
			stepmax = x[j];
		}
		else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = stepmax * eps3;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		fp = FUNCPT_EVAL(funcpt,x,N);
		if (fp >= DBL_MAX || fp <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fp != fp) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		x[j] = temp - stepsize;
		fm = FUNCPT_EVAL(funcpt,x,N);
		if (fm >= DBL_MAX || fm <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fm != fm) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		f[j] = (fp - fm)/ (2 * stepsize);
		x[j] = temp;
	}

	return retval;
}